

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

jint Java_fr_limsi_wapiti_WapitiJNI_runWapiti(JNIEnv *jenv,jclass jcls,jstring jarg1)

{
  int iVar1;
  char *arg;
  
  if (jarg1 == (jstring)0x0) {
    arg = (char *)0x0;
  }
  else {
    arg = (*jenv->functions->GetStringUTFChars)(jenv,jarg1,(jboolean *)0x0);
    if (arg == (char *)0x0) {
      return 0;
    }
  }
  iVar1 = runWapiti(arg);
  if (arg != (char *)0x0) {
    (*jenv->functions->ReleaseStringUTFChars)(jenv,jarg1,arg);
  }
  return iVar1;
}

Assistant:

SWIGEXPORT jint JNICALL Java_fr_limsi_wapiti_WapitiJNI_runWapiti(JNIEnv *jenv, jclass jcls, jstring jarg1) {
  jint jresult = 0 ;
  char *arg1 = (char *) 0 ;
  int result;
  
  (void)jenv;
  (void)jcls;
  arg1 = 0;
  if (jarg1) {
    arg1 = (char *)jenv->GetStringUTFChars(jarg1, 0);
    if (!arg1) return 0;
  }
  {
    try {
      result = (int)runWapiti(arg1); 
    }
    catch (char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, e); return 0; 
      }; 
    }
    catch (const char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, (char*)e); return 0; 
      }; 
    }
  }
  jresult = (jint)result; 
  if (arg1) jenv->ReleaseStringUTFChars(jarg1, (const char *)arg1);
  return jresult;
}